

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

uint32_t lua_hashstring(lua_State *L,int idx)

{
  TValue *pTVar1;
  ulong uVar2;
  int in_ESI;
  lua_State *in_RDI;
  GCstr *s;
  TValue *o;
  uint32_t local_4;
  
  pTVar1 = index2adr(in_RDI,in_ESI);
  uVar2 = (ulong)(pTVar1->u32).lo;
  if (*(byte *)(uVar2 + 7) < 0xc0) {
    local_4 = *(uint32_t *)(uVar2 + 8);
  }
  else {
    local_4 = lua_hash((char *)(uVar2 + 0x10),*(uint32_t *)(uVar2 + 0xc));
  }
  return local_4;
}

Assistant:

LUA_API uint32_t lua_hashstring(lua_State *L, int idx)
{
  TValue *o = index2adr(L, idx);
  lj_checkapi(tvisstr(o), "stack slot %d is not a string", idx);
  GCstr *s = strV(o);
  if (! strsmart(s))
    return s->hash;
  return lua_hash(strdata(s), s->len);
}